

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidgetPrivate::resolveLocale(QWidgetPrivate *this)

{
  uint uVar1;
  long lVar2;
  long in_FS_OFFSET;
  QLocale local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(*(long *)&this->field_0x8 + 8);
  uVar1 = *(uint *)(lVar2 + 0x244);
  if ((uVar1 >> 0x17 & 1) == 0) {
    lVar2 = *(long *)(lVar2 + 0x10);
    if ((lVar2 == 0) ||
       (((uVar1 >> 0x10 & 1) == 0 &&
        ((*(uint *)(*(long *)(*(long *)&this->field_0x8 + 0x20) + 0xc) & 1) != 0)))) {
      QLocale::QLocale(&local_20);
    }
    else {
      QLocale::QLocale(&local_20,(QLocale *)(*(long *)(lVar2 + 8) + 0x210));
    }
    setLocale_helper(this,&local_20,false);
    QLocale::~QLocale(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::resolveLocale()
{
    Q_Q(const QWidget);

    if (!q->testAttribute(Qt::WA_SetLocale)) {
        QWidget *parent = q->parentWidget();
        setLocale_helper(!parent || (q->isWindow() && !q->testAttribute(Qt::WA_WindowPropagation))
                         ? QLocale() : parent->locale());
    }
}